

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpkAbcDsd.c
# Opt level: O1

Vec_Int_t * Lpk_MergeBoundSets(Vec_Int_t *vSets0,Vec_Int_t *vSets1,int nSizeMax)

{
  uint uVar1;
  Vec_Int_t *p;
  int *piVar2;
  uint uVar3;
  uint Entry;
  long lVar4;
  long local_50;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar2 = (int *)malloc(400);
  p->pArray = piVar2;
  if (0 < vSets0->nSize) {
    local_50 = 0;
    do {
      if (0 < vSets1->nSize) {
        uVar1 = vSets0->pArray[local_50];
        lVar4 = 0;
        do {
          Entry = vSets1->pArray[lVar4] | uVar1;
          if ((((int)Entry >> 0x10 & Entry) == 0) &&
             (uVar3 = (Entry >> 1 & 0x5555) + (Entry & 0x5555),
             uVar3 = (uVar3 >> 2 & 0x3333) + (uVar3 & 0x3333),
             uVar3 = (uVar3 >> 4 & 0x707) + (uVar3 & 0x707),
             (int)((uVar3 >> 8) + (uVar3 & 0xff)) <= nSizeMax)) {
            Vec_IntPush(p,Entry);
          }
          lVar4 = lVar4 + 1;
        } while (lVar4 < vSets1->nSize);
      }
      local_50 = local_50 + 1;
    } while (local_50 < vSets0->nSize);
  }
  return p;
}

Assistant:

Vec_Int_t * Lpk_MergeBoundSets( Vec_Int_t * vSets0, Vec_Int_t * vSets1, int nSizeMax )
{
    Vec_Int_t * vSets;
    int Entry0, Entry1, Entry;
    int i, k;
    vSets = Vec_IntAlloc( 100 );
    Vec_IntForEachEntry( vSets0, Entry0, i )
    Vec_IntForEachEntry( vSets1, Entry1, k )
    {
        Entry = Entry0 | Entry1;
        if ( (Entry & (Entry >> 16)) )
            continue;
        if ( Kit_WordCountOnes(Entry & 0xffff) <= nSizeMax )
            Vec_IntPush( vSets, Entry );
    }
    return vSets;
}